

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void __thiscall
asl::HttpServer::serveFile(HttpServer *this,HttpRequest *request,HttpResponse *response)

{
  bool bVar1;
  undefined1 local_130 [48];
  String path;
  Date ifdate;
  String local_d0;
  String local_b8;
  String local_a0;
  File file;
  String localpath;
  
  bVar1 = String::operator==(&request->_method,"GET");
  if (!bVar1) {
    HttpResponse::setCode(response,0x1f5);
    String::String((String *)&file,"Content-Type");
    String::String(&path,"text/plain");
    HttpMessage::setHeader(&response->super_HttpMessage,(String *)&file,&path);
    String::~String(&path);
    String::~String((String *)&file);
    HttpMessage::put(&response->super_HttpMessage,"Not implemented");
    return;
  }
  String::String(&path,&request->_path);
  bVar1 = String::endsWith(&path,"/");
  if (bVar1) {
    String::operator+=(&path,"index.html");
  }
  String::operator+(&localpath,&this->_webroot,&path);
  File::File(&file,&localpath);
  bVar1 = File::isDirectory(&file);
  if (bVar1) {
    HttpResponse::setCode(response,0x12d);
    String::String((String *)local_130,"Location");
    String::String(&local_d0,"Host");
    HttpMessage::header(&local_b8,&request->super_HttpMessage,&local_d0);
    operator+(&local_a0,"http://",&local_b8);
    String::operator+((String *)&ifdate,&local_a0,&path);
    String::operator+((String *)(local_130 + 0x18),(String *)&ifdate,'/');
    HttpMessage::setHeader
              (&response->super_HttpMessage,(String *)local_130,(String *)(local_130 + 0x18));
    String::~String((String *)(local_130 + 0x18));
    String::~String((String *)&ifdate);
    String::~String(&local_a0);
    String::~String(&local_b8);
    String::~String(&local_d0);
    String::~String((String *)local_130);
  }
  else {
    bVar1 = File::exists(&file);
    if (bVar1) {
      String::String((String *)local_130,"If-Modified-Since");
      bVar1 = HttpMessage::hasHeader(&request->super_HttpMessage,(String *)local_130);
      String::~String((String *)local_130);
      if (bVar1) {
        String::String((String *)(local_130 + 0x18),"If-Modified-Since");
        HttpMessage::header((String *)local_130,&request->super_HttpMessage,
                            (String *)(local_130 + 0x18));
        Date::Date(&ifdate,(String *)local_130);
        String::~String((String *)local_130);
        String::~String((String *)(local_130 + 0x18));
        File::lastModified((File *)local_130);
        if ((double)local_130._0_8_ <= ifdate._t + 1.0) {
          HttpResponse::setCode(response,0x130);
          goto LAB_00126a31;
        }
      }
      String::String((String *)local_130,"Last-Modified");
      File::lastModified((File *)&ifdate);
      Date::toString((String *)(local_130 + 0x18),&ifdate,HTTP);
      HttpMessage::setHeader
                (&response->super_HttpMessage,(String *)local_130,(String *)(local_130 + 0x18));
      String::~String((String *)(local_130 + 0x18));
      String::~String((String *)local_130);
      HttpMessage::put(&response->super_HttpMessage,&file);
    }
    else {
      HttpResponse::setCode(response,0x194);
      String::String((String *)local_130,"Content-Type");
      String::String((String *)(local_130 + 0x18),"text/plain");
      HttpMessage::setHeader
                (&response->super_HttpMessage,(String *)local_130,(String *)(local_130 + 0x18));
      String::~String((String *)(local_130 + 0x18));
      String::~String((String *)local_130);
      HttpMessage::put(&response->super_HttpMessage,"Not found");
    }
  }
LAB_00126a31:
  File::~File(&file);
  String::~String(&localpath);
  String::~String(&path);
  return;
}

Assistant:

void HttpServer::serveFile(HttpRequest& request, HttpResponse& response)
{
	if (request.method() == "GET")
	{
		String path = request.path();

		if (path.endsWith("/"))
			path += "index.html";

		String localpath = _webroot + path;
		File file(localpath);
		if (file.isDirectory())
		{
			response.setCode(301);
			response.setHeader("Location", "http://" + request.header("Host") + path + '/');
		}
		else if (file.exists())
		{
			if (request.hasHeader("If-Modified-Since"))
			{
				Date ifdate = request.header("If-Modified-Since");
				if (file.lastModified() <= ifdate + 1.0) {
					response.setCode(304);
					return;
				}
			}
			response.setHeader("Last-Modified", file.lastModified().toString(Date::HTTP));
			response.put(file);
		}
		else
		{
			response.setCode(404);
			response.setHeader("Content-Type", "text/plain");
			response.put("Not found");
		}
	}
	else
	{
		response.setCode(501);
		response.setHeader("Content-Type", "text/plain");
		response.put("Not implemented");
	}
}